

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_router_interface.c
# Opt level: O2

void dlep_router_interface_init(void)

{
  oonf_class_add(&_router_if_class);
  dlep_extension_init();
  dlep_session_init();
  dlep_router_session_init();
  dlep_base_proto_router_init();
  dlep_base_metric_init();
  dlep_base_ip_init();
  dlep_l1_statistics_init();
  dlep_l2_statistics_init();
  dlep_radio_attributes_init();
  dlep_lid_init();
  oonf_layer2_origin_add(&_l2_origin);
  oonf_timer_add(&_connect_to_watchdog_class);
  return;
}

Assistant:

void
dlep_router_interface_init(void) {
  oonf_class_add(&_router_if_class);

  dlep_extension_init();
  dlep_session_init();
  dlep_router_session_init();
  dlep_base_proto_router_init();
  dlep_base_metric_init();
  dlep_base_ip_init();
  dlep_l1_statistics_init();
  dlep_l2_statistics_init();
  dlep_radio_attributes_init();
  dlep_lid_init();

  _shutting_down = false;

  oonf_layer2_origin_add(&_l2_origin);
  oonf_timer_add(&_connect_to_watchdog_class);
}